

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimics_pcre_test.cc
# Opt level: O2

void re2::MimicsPCRESimpleTests(void)

{
  char cVar1;
  char *str;
  bool bVar2;
  Regexp *this;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  undefined1 local_1b0 [384];
  
  for (lVar4 = 0; lVar4 != 0x1f; lVar4 = lVar4 + 1) {
    str = (&tests)[lVar4 * 2];
    iVar6 = 2;
    while (iVar6 != 0) {
      StringPiece::StringPiece((StringPiece *)local_1b0,str);
      this = Regexp::Parse((StringPiece *)local_1b0,(uint)(iVar6 == 2) << 5 | LikePerl,
                           (RegexpStatus *)0x0);
      if (this == (Regexp *)0x0) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/mimics_pcre_test.cc"
                   ,0x43);
        poVar3 = std::operator<<((ostream *)(local_1b0 + 8),"Check failed: re");
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,str);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
      }
      cVar1 = (&DAT_0012b1f8)[lVar4 * 0x10];
      bVar2 = Regexp::MimicsPCRE(this);
      if ((bool)cVar1 != bVar2) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/mimics_pcre_test.cc"
                   ,0x44);
        poVar3 = std::operator<<((ostream *)(local_1b0 + 8),
                                 "Check failed: (t.should_match) == (re->MimicsPCRE())");
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = std::operator<<(poVar3,str);
        poVar3 = std::operator<<(poVar3," ");
        pcVar5 = "utf";
        if (iVar6 == 2) {
          pcVar5 = "latin1";
        }
        std::operator<<(poVar3,pcVar5);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
      }
      Regexp::Decref(this);
      iVar6 = iVar6 + -1;
    }
  }
  return;
}

Assistant:

TEST(MimicsPCRE, SimpleTests) {
  for (int i = 0; i < arraysize(tests); i++) {
    const PCRETest& t = tests[i];
    for (int j = 0; j < 2; j++) {
      Regexp::ParseFlags flags = Regexp::LikePerl;
      if (j == 0)
        flags = flags | Regexp::Latin1;
      Regexp* re = Regexp::Parse(t.regexp, flags, NULL);
      CHECK(re) << " " << t.regexp;
      CHECK_EQ(t.should_match, re->MimicsPCRE())
        << " " << t.regexp << " "
        << (j==0 ? "latin1" : "utf");
      re->Decref();
    }
  }
}